

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum_core.c
# Opt level: O2

mbedtls_ct_condition_t mbedtls_mpi_core_lt_ct(mbedtls_mpi_uint *A,mbedtls_mpi_uint *B,size_t limbs)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  
  uVar4 = 0;
  uVar3 = 0;
  while (bVar5 = limbs != 0, limbs = limbs - 1, bVar5) {
    uVar2 = A[limbs];
    uVar1 = B[limbs] ^ uVar2;
    uVar4 = (long)(B[limbs] - uVar2 & ~uVar1 | uVar2 & uVar1) >> 0x3f | uVar4;
    uVar2 = B[limbs];
    uVar1 = A[limbs] ^ uVar2;
    uVar2 = (long)(A[limbs] - uVar2 & ~uVar1 | uVar2 & uVar1) >> 0x3f;
    uVar3 = uVar3 | ~uVar4 & uVar2;
    uVar4 = uVar4 | uVar2;
  }
  return uVar3;
}

Assistant:

mbedtls_ct_condition_t mbedtls_mpi_core_lt_ct(const mbedtls_mpi_uint *A,
                                              const mbedtls_mpi_uint *B,
                                              size_t limbs)
{
    mbedtls_ct_condition_t ret = MBEDTLS_CT_FALSE, cond = MBEDTLS_CT_FALSE, done = MBEDTLS_CT_FALSE;

    for (size_t i = limbs; i > 0; i--) {
        /*
         * If B[i - 1] < A[i - 1] then A < B is false and the result must
         * remain 0.
         *
         * Again even if we can make a decision, we just mark the result and
         * the fact that we are done and continue looping.
         */
        cond = mbedtls_ct_uint_lt(B[i - 1], A[i - 1]);
        done = mbedtls_ct_bool_or(done, cond);

        /*
         * If A[i - 1] < B[i - 1] then A < B is true.
         *
         * Again even if we can make a decision, we just mark the result and
         * the fact that we are done and continue looping.
         */
        cond = mbedtls_ct_uint_lt(A[i - 1], B[i - 1]);
        ret  = mbedtls_ct_bool_or(ret, mbedtls_ct_bool_and(cond, mbedtls_ct_bool_not(done)));
        done = mbedtls_ct_bool_or(done, cond);
    }

    /*
     * If all the limbs were equal, then the numbers are equal, A < B is false
     * and leaving the result 0 is correct.
     */

    return ret;
}